

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void __thiscall Process::handleInput(Process *this,int fd)

{
  String *this_00;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  undefined1 local_88 [32];
  size_type local_68;
  deque<String,_std::allocator<String>_> *local_60;
  EventLoop *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _Bind<void_(Process::*(Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)> local_48
  ;
  
  EventLoop::eventLoop();
  if ((EventLoop *)local_88._0_8_ == (EventLoop *)0x0) {
    __assert_fail("EventLoop::eventLoop()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                  ,0x2ec,"void Process::handleInput(int)");
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  EventLoop::eventLoop();
  EventLoop::unregisterSocket((EventLoop *)local_88._0_8_,fd);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  local_60 = &this->mStdInBuffer;
  do {
    this_00 = (this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    if ((this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == this_00) {
      return;
    }
    local_68 = (this_00->mString)._M_string_length;
    iVar1 = (int)local_68;
    if (this->mStdInIndex == 0) {
      while( true ) {
        sVar2 = ::write(fd,(this_00->mString)._M_dataplus._M_p,(long)iVar1);
        iVar5 = (int)sVar2;
        if (iVar5 != -1) break;
        piVar3 = __errno_location();
        if (*piVar3 != 4) goto LAB_0018f3a9;
      }
    }
    else {
      uVar4 = iVar1 - this->mStdInIndex;
      local_68 = (size_type)uVar4;
      while( true ) {
        String::mid((String *)local_88,this_00,(long)this->mStdInIndex,0xffffffffffffffff);
        sVar2 = ::write(fd,(void *)local_88._0_8_,(long)(int)uVar4);
        iVar5 = (int)sVar2;
        std::__cxx11::string::~string((string *)local_88);
        if (iVar5 != -1) break;
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
LAB_0018f3a9:
          EventLoop::eventLoop();
          local_48._M_f = (offset_in_Process_to_subr)processCallback;
          local_48._8_8_ = 0;
          local_48._M_bound_args.
          super__Tuple_impl<0UL,_Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>.
          super__Head_base<0UL,_Process_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)
               (_Tuple_impl<0UL,_Process_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>)this;
          std::function<void(int,unsigned_int)>::
          function<std::_Bind<void(Process::*(Process*,std::_Placeholder<1>,std::_Placeholder<2>))(int,int)>,void>
                    ((function<void(int,unsigned_int)> *)local_88,&local_48);
          EventLoop::registerSocket(local_58,fd,2,(function<void_(int,_unsigned_int)> *)local_88);
          std::_Function_base::~_Function_base((_Function_base *)local_88);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
          return;
        }
      }
    }
    if (iVar5 == (int)local_68) {
      std::deque<String,_std::allocator<String>_>::pop_front(local_60);
      iVar5 = 0;
      if (((this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur ==
           (this->mStdInBuffer).super__Deque_base<String,_std::allocator<String>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur) && (iVar5 = 0, this->mWantStdInClosed == true)) {
        EventLoop::eventLoop();
        EventLoop::unregisterSocket((EventLoop *)local_88._0_8_,this->mStdIn[1]);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
        do {
          iVar1 = close(this->mStdIn[1]);
          if (iVar1 != -1) break;
          piVar3 = __errno_location();
        } while (*piVar3 == 4);
        this->mStdIn[1] = -1;
        this->mWantStdInClosed = false;
      }
    }
    else {
      iVar5 = iVar5 + this->mStdInIndex;
    }
    this->mStdInIndex = iVar5;
  } while( true );
}

Assistant:

void Process::handleInput(int fd)
{
    assert(EventLoop::eventLoop());
    EventLoop::eventLoop()->unregisterSocket(fd);

    //static int ting = 0;
    //printf("Process::handleInput (cnt=%d)\n", ++ting);
    for (;;) {
        if (mStdInBuffer.empty())
            return;

        //printf("Process::handleInput in loop\n");
        int w, want;
        const String &front = mStdInBuffer.front();
        if (mStdInIndex) {
            want = front.size() - mStdInIndex;
            eintrwrap(w, ::write(fd, front.mid(mStdInIndex).constData(), want));
        } else {
            want = front.size();
            eintrwrap(w, ::write(fd, front.constData(), want));
        }
        if (w == -1) {
            EventLoop::eventLoop()->registerSocket(fd, EventLoop::SocketWrite, std::bind(&Process::processCallback, this, std::placeholders::_1, std::placeholders::_2));
            break;
        } else if (w == want) {
            mStdInBuffer.pop_front();
            if (mStdInBuffer.empty() && mWantStdInClosed) {
                EventLoop::eventLoop()->unregisterSocket(mStdIn[1]);
                int err;
                eintrwrap(err, ::close(mStdIn[1]));
                mStdIn[1] = -1;
                mWantStdInClosed = false;
            }
            mStdInIndex = 0;
        } else
            mStdInIndex += w;
    }
}